

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_createinstance(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQInstance *x;
  HSQUIRRELVM in_RSI;
  SQClass *in_RDI;
  SQObjectPtr *o;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  SQObjectPtr **in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffdc;
  SQRESULT local_8;
  
  bVar1 = sq_aux_gettypedarg(in_RSI,0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
  if (bVar1) {
    x = SQClass::CreateInstance(in_RDI);
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffd0,x);
    SQVM::Push((SQVM *)in_RDI,in_stack_ffffffffffffffa8);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
    local_8 = 0;
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

SQRESULT sq_createinstance(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_CLASS,o);
    v->Push(_class(*o)->CreateInstance());
    return SQ_OK;
}